

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<bool>::internalSetData<std::vector<double,std::allocator<double>>>
          (Parameter<bool> *this,vector<double,_std::allocator<double>_> *data)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  bool result;
  bool tmp;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  vector<double,_std::allocator<double>_> local_30;
  RepType_conflict local_11 [9];
  
  local_11[0] = false;
  std::vector<double,_std::allocator<double>_>::vector(unaff_retaddr,in_RDI);
  bVar1 = ParameterTraits<bool>::convert<std::vector<double,std::allocator<double>>>
                    (&local_30,local_11);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_ffffffffffffffc4,uVar2));
  if ((uVar2 & 0x1000000) != 0) {
    *(undefined1 *)
     ((long)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 2) = 0;
    *(byte *)((long)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3) = local_11[0] & 1;
  }
  return (bool)((byte)(uVar2 >> 0x18) & 1);
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }